

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManUnivTfo_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes,Vec_Int_t *vPos)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  undefined4 local_3c;
  int Count;
  int iFan;
  int i;
  Vec_Int_t *vPos_local;
  Vec_Int_t *vNodes_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  local_3c = 1;
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    if (vNodes != (Vec_Int_t *)0x0) {
      pGVar2 = Gia_ManObj(p,iObj);
      iVar1 = Gia_ObjIsCo(pGVar2);
      if (iVar1 != 0) {
        Vec_IntPush(vNodes,iObj);
      }
    }
    if (vPos != (Vec_Int_t *)0x0) {
      pGVar2 = Gia_ManObj(p,iObj);
      iVar1 = Gia_ObjIsCo(pGVar2);
      if (iVar1 != 0) {
        Vec_IntPush(vPos,iObj);
      }
    }
    for (Count = 0; iVar1 = Gia_ObjFanoutNumId(p,iObj), Count < iVar1; Count = Count + 1) {
      iVar1 = Gia_ObjFanoutId(p,iObj,Count);
      iVar1 = Gia_ManUnivTfo_rec(p,iVar1,vNodes,vPos);
      local_3c = iVar1 + local_3c;
    }
    p_local._4_4_ = local_3c;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManUnivTfo_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes, Vec_Int_t * vPos )
{
    int i, iFan, Count = 1;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    if ( vNodes && Gia_ObjIsCo(Gia_ManObj(p, iObj)) )
        Vec_IntPush( vNodes, iObj );    
    if ( vPos && Gia_ObjIsCo(Gia_ManObj(p, iObj)) )
        Vec_IntPush( vPos, iObj );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        Count += Gia_ManUnivTfo_rec( p, iFan, vNodes, vPos );
    return Count;
}